

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O3

void Gia_ManLutPacking(Gia_Man_t *p,int nBlockSize,int DelayRoute,int DelayDir,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  void *__s;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int Delays [32];
  int Perm [32];
  void *local_178;
  ulong local_160;
  int *local_150;
  int *local_148;
  int local_13c [33];
  int local_b8 [34];
  
  local_13c[0] = DelayDir;
  pVVar5 = Gia_ManLutCollect(p);
  iVar13 = p->nObjs;
  iVar2 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar2 = iVar13;
  }
  if (iVar2 == 0) {
    local_150 = (int *)malloc(0x10);
    local_148 = local_150 + 1;
    *local_150 = 0;
    local_150[2] = 0;
    local_150[3] = 0;
    local_150[1] = iVar13;
    local_178 = (void *)0x0;
  }
  else {
    local_178 = malloc((long)iVar2 << 2);
    if (local_178 != (void *)0x0) {
      memset(local_178,0,(long)iVar13 * 4);
    }
    local_150 = (int *)malloc(0x10);
    local_148 = local_150 + 1;
    *local_150 = iVar2;
    __s = malloc((long)iVar2 << 2);
    *(void **)(local_150 + 2) = __s;
    local_150[1] = iVar13;
    if (__s != (void *)0x0) {
      memset(__s,0,(long)iVar13 << 2);
    }
  }
  uVar12 = pVVar5->nSize;
  iVar17 = (int)(uVar12 * 2) / nBlockSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar2 = iVar17;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar6;
  if ((int)uVar12 < 1) {
    local_160 = 0;
    uVar18 = 0;
LAB_0079452c:
    bVar1 = false;
    uVar4 = 0;
  }
  else {
    piVar6 = pVVar5->pArray;
    uVar18 = 0;
    local_160 = 0;
    do {
      iVar2 = piVar6[uVar18];
      lVar16 = (long)iVar2;
      if (lVar16 < 0) goto LAB_00794886;
      uVar4 = p->vMapping->nSize;
      if ((int)uVar4 <= iVar2) goto LAB_00794886;
      piVar7 = p->vMapping->pArray;
      lVar8 = (long)piVar7[lVar16];
      if ((lVar8 < 0) || (uVar4 <= (uint)piVar7[lVar16])) goto LAB_00794886;
      iVar17 = piVar7[lVar8];
      lVar11 = (long)iVar17;
      if (0x20 < lVar11) {
        __assert_fail("nSize <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0x8a,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar17 < 1) {
LAB_007943ec:
        bVar1 = false;
      }
      else {
        lVar9 = 0;
        do {
          iVar3 = piVar7[lVar8 + lVar9 + 1];
          if (((long)iVar3 < 0) || (iVar13 <= iVar3)) goto LAB_00794886;
          local_13c[lVar9 + 1] = *(int *)((long)local_178 + (long)iVar3 * 4);
          local_b8[lVar9] = iVar3;
          lVar9 = lVar9 + 1;
        } while (lVar11 != lVar9);
        bVar1 = iVar17 != 1;
        if (iVar17 == 1) goto LAB_007943ec;
        lVar8 = 1;
        uVar10 = 0;
        do {
          uVar14 = uVar10 & 0xffffffff;
          lVar9 = lVar8;
          do {
            uVar4 = (uint)lVar9;
            if (local_13c[lVar9 + 1] <= local_13c[(long)(int)(uint)uVar14 + 1]) {
              uVar4 = (uint)uVar14;
            }
            lVar9 = lVar9 + 1;
            uVar14 = (ulong)uVar4;
          } while (lVar11 != lVar9);
          iVar3 = local_b8[uVar10];
          local_b8[uVar10] = local_b8[(int)uVar4];
          iVar15 = local_13c[uVar10 + 1];
          local_13c[uVar10 + 1] = local_13c[(long)(int)uVar4 + 1];
          uVar10 = uVar10 + 1;
          local_b8[(int)uVar4] = iVar3;
          local_13c[(long)(int)uVar4 + 1] = iVar15;
          lVar8 = lVar8 + 1;
        } while (uVar10 != iVar17 - 1);
        if (local_13c[1] < local_13c[(ulong)(iVar17 - 1) + 1]) {
          __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                        ,0x91,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
        }
      }
      iVar17 = local_13c[1];
      if ((local_13c[1] < 0) || (local_13c[lVar11] < 0)) {
        __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0x92,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      if (((long)local_b8[0] < 0) || (iVar3 = *local_148, iVar3 <= local_b8[0])) goto LAB_00794886;
      lVar8 = *(long *)(local_150 + 2);
      if ((local_13c[1] == 0) || (local_13c[1] <= local_13c[2])) {
LAB_0079447b:
        if (iVar3 <= iVar2) goto LAB_007948a5;
        *(int *)(lVar8 + lVar16 * 4) = p_00->nSize;
        Vec_IntPush(p_00,1);
        iVar3 = DelayRoute;
      }
      else {
        uVar4 = *(uint *)(lVar8 + (long)local_b8[0] * 4);
        if (((int)uVar4 < 0) || (p_00->nSize <= (int)uVar4)) goto LAB_00794886;
        piVar7 = p_00->pArray;
        if (nBlockSize <= piVar7[uVar4]) goto LAB_0079447b;
        if (iVar3 <= iVar2) goto LAB_007948a5;
        *(uint *)(lVar8 + lVar16 * 4) = uVar4;
        piVar7 = piVar7 + uVar4;
        *piVar7 = *piVar7 + 1;
        iVar3 = local_13c[0];
      }
      uVar10 = (ulong)(uint)(iVar3 + iVar17);
      if (bVar1) {
        lVar8 = 1;
        do {
          if ((int)uVar10 <= local_13c[lVar8 + 1] + DelayRoute) {
            uVar10 = (ulong)(uint)(local_13c[lVar8 + 1] + DelayRoute);
          }
          lVar8 = lVar8 + 1;
        } while (lVar11 != lVar8);
      }
      if (iVar13 <= iVar2) {
LAB_007948a5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(int *)((long)local_178 + lVar16 * 4) = (int)uVar10;
      if ((int)local_160 <= (int)uVar10) {
        local_160 = uVar10;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar12);
    uVar18 = (ulong)p_00->nSize;
    bVar1 = 0 < (long)uVar18;
    if ((long)uVar18 < 1) goto LAB_0079452c;
    uVar10 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + p_00->pArray[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar18 != uVar10);
  }
  if (uVar4 != uVar12) {
    __assert_fail("Vec_IntSum(vBSize) == Vec_IntSize(vOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xa7,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  iVar13 = (int)uVar18;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar2 = iVar13 + uVar12 + 1;
  if (iVar13 + uVar12 < 0xf) {
    iVar2 = 0x10;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar2;
  if (iVar2 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar2 << 2);
  }
  p_01->pArray = piVar6;
  Vec_IntPush(p_01,iVar13);
  p_02 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar2 = iVar13;
  }
  p_02->nSize = 0;
  p_02->nCap = iVar2;
  if (iVar2 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar2 << 2);
  }
  p_02->pArray = piVar6;
  if (bVar1) {
    piVar6 = p_00->pArray;
    uVar10 = 0;
    do {
      iVar13 = piVar6[uVar10];
      Vec_IntPush(p_01,iVar13);
      iVar2 = p_01->nSize;
      Vec_IntPush(p_02,iVar2);
      if (0 < iVar13) {
        iVar17 = iVar13 + iVar2;
        iVar3 = p_01->nCap;
        iVar15 = iVar3 * 2;
        if (iVar15 < iVar17) {
          if (iVar3 < iVar17) {
            if (p_01->pArray == (int *)0x0) {
              piVar7 = (int *)malloc((long)iVar17 << 2);
            }
            else {
              piVar7 = (int *)realloc(p_01->pArray,(long)iVar17 << 2);
            }
            p_01->pArray = piVar7;
            iVar15 = iVar17;
LAB_0079467d:
            if (piVar7 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_01->nCap = iVar15;
          }
        }
        else if (iVar3 < iVar17) {
          if (p_01->pArray == (int *)0x0) {
            piVar7 = (int *)malloc((long)iVar3 << 3);
          }
          else {
            piVar7 = (int *)realloc(p_01->pArray,(long)iVar3 << 3);
          }
          p_01->pArray = piVar7;
          goto LAB_0079467d;
        }
        memset(p_01->pArray + iVar2,0xff,(ulong)(iVar13 - 1) * 4 + 4);
        p_01->nSize = iVar17;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar18 & 0xffffffff) != uVar10);
  }
  if ((p_01->nCap != 0x10) && (p_01->nSize != p_01->nCap)) {
    __assert_fail("Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xb3,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  if ((int)uVar12 < 1) {
    uVar12 = p_01->nSize;
    if (0 < (int)uVar12) goto LAB_00794770;
  }
  else {
    piVar6 = pVVar5->pArray;
    uVar18 = (ulong)uVar12 + 1;
    do {
      iVar13 = piVar6[uVar18 - 2];
      if (((long)iVar13 < 0) || (*local_148 <= iVar13)) {
LAB_00794886:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = *(int *)(*(long *)(local_150 + 2) + (long)iVar13 * 4);
      lVar16 = (long)iVar2;
      if ((lVar16 < 0) || (p_02->nSize <= iVar2)) goto LAB_00794886;
      piVar7 = p_02->pArray;
      iVar2 = piVar7[lVar16];
      lVar8 = (long)iVar2;
      if ((lVar8 < 0) || (uVar12 = p_01->nSize, (int)uVar12 <= iVar2)) goto LAB_00794886;
      if (p_01->pArray[lVar8] != -1) {
        __assert_fail("Vec_IntEntry(vPacking, Start) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                      ,0xb9,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
      }
      p_01->pArray[lVar8] = iVar13;
      piVar7 = piVar7 + lVar16;
      *piVar7 = *piVar7 + 1;
      uVar18 = uVar18 - 1;
    } while (1 < uVar18);
LAB_00794770:
    uVar18 = 0;
    iVar13 = 0;
    do {
      iVar13 = iVar13 + (uint)(p_01->pArray[uVar18] == -1);
      uVar18 = uVar18 + 1;
    } while (uVar12 != uVar18);
    if (iVar13 != 0) {
      __assert_fail("Vec_IntCountEntry(vPacking, -1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0xbd,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  if (local_178 != (void *)0x0) {
    free(local_178);
  }
  if (*(void **)(local_150 + 2) != (void *)0x0) {
    free(*(void **)(local_150 + 2));
  }
  free(local_150);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  pVVar5 = p->vPacking;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vPacking->pArray = (int *)0x0;
      pVVar5 = p->vPacking;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00794859;
    }
    free(pVVar5);
  }
LAB_00794859:
  p->vPacking = p_01;
  printf("Global delay = %d.\n",local_160);
  return;
}

Assistant:

void Gia_ManLutPacking( Gia_Man_t * p, int nBlockSize, int DelayRoute, int DelayDir, int fVerbose )
{
    int Delays[32], Perm[32];
    Vec_Int_t * vPacking, * vStarts;
    Vec_Int_t * vOrder = Gia_ManLutCollect( p );
    Vec_Int_t * vDelay = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBlock = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBSize = Vec_IntAlloc( 2 * Vec_IntSize(vOrder) / nBlockSize );
    int i, k, Id, iFan, nSize, iBlock, Delay, DelayMax = 0;
    // create blocks
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        nSize = Gia_ObjLutSize( p, Id );
        assert( nSize <= 32 );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            Delays[k] = Vec_IntEntry(vDelay, iFan);
            Perm[k] = iFan;
        }
        Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
        assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
        assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
        // check if we can reduce delay by adding it to the same bin as the latest one
        iBlock = Vec_IntEntry( vBlock, Perm[0] );
        if ( Delays[0] > 0 && Delays[0] > Delays[1] && Vec_IntEntry(vBSize, iBlock) < nBlockSize )
        {
            Delay = Delays[0] + DelayDir;
            Vec_IntWriteEntry( vBlock, Id, iBlock );
            Vec_IntAddToEntry( vBSize, iBlock, 1 );
        }
        else // clean new block
        {
            Delay = Delays[0] + DelayRoute;
            Vec_IntWriteEntry( vBlock, Id, Vec_IntSize(vBSize) );
            Vec_IntPush( vBSize, 1 );
        }
        // calculate delay
        for ( k = 1; k < nSize; k++ )
            Delay = Abc_MaxInt( Delay, Delays[k] + DelayRoute );
        Vec_IntWriteEntry( vDelay, Id, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    assert( Vec_IntSum(vBSize) == Vec_IntSize(vOrder) );
    // create packing info
    vPacking = Vec_IntAlloc( Vec_IntSize(vBSize) + Vec_IntSize(vOrder) + 1 );
    Vec_IntPush( vPacking, Vec_IntSize(vBSize) );
    // create starting places for each block
    vStarts = Vec_IntAlloc( Vec_IntSize(vBSize) );
    Vec_IntForEachEntry( vBSize, nSize, i )
    {
        Vec_IntPush( vPacking, nSize );
        Vec_IntPush( vStarts, Vec_IntSize(vPacking) );
        Vec_IntFillExtra( vPacking, Vec_IntSize(vPacking) + nSize, -1 );
    }
    assert( Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking) );
    // collect LUTs from the block
    Vec_IntForEachEntryReverse( vOrder, Id, i )
    {
        int Block = Vec_IntEntry( vBlock, Id );
        int Start = Vec_IntEntry( vStarts, Block );
        assert( Vec_IntEntry(vPacking, Start) == -1 );
        Vec_IntWriteEntry( vPacking, Start, Id );
        Vec_IntAddToEntry( vStarts, Block, 1 );
    }
    assert( Vec_IntCountEntry(vPacking, -1) == 0 );
    // cleanup
    Vec_IntFree( vOrder );
    Vec_IntFree( vDelay );
    Vec_IntFree( vBlock );
    Vec_IntFree( vBSize );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vPacking );
    p->vPacking = vPacking;
    printf( "Global delay = %d.\n", DelayMax );
}